

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codegen.c
# Opt level: O3

void gen_expr(_node_t *node)

{
  node_type_e nVar1;
  size_t __size;
  char *__ptr;
  
  if (node->id == 0x87) {
    fwrite("; load constant\n",0x10,1,(FILE *)f);
    if (node->num_value != 0) {
      fprintf((FILE *)f,"        ld      a, $%02X\n");
      return;
    }
    __ptr = "        xor     a\n";
  }
  else {
    if (node->id == 0x86) {
      fprintf((FILE *)f,"        ld      bc, %s\n",node->identifier);
      __ptr = "        ld      a, [bc]\n";
      __size = 0x18;
      goto LAB_00104229;
    }
    nVar1 = node->type;
    if (nVar1 == BINOP) {
      gen_expr(*node->children);
      fwrite("        push    af\n",0x13,1,(FILE *)f);
      gen_expr(node->children[1]);
      switch(node->id) {
      case 0x25:
        fwrite("; modulo \n",10,1,(FILE *)f);
        fwrite("        pop     de\n",0x13,1,(FILE *)f);
        fwrite("        ld      e, a\n",0x15,1,(FILE *)f);
        __ptr = "        call    ___div_u8_\n";
        __size = 0x1b;
        goto LAB_00104229;
      default:
        goto switchD_00103fd4_caseD_26;
      case 0x2a:
        fwrite("; multiplication \n",0x12,1,(FILE *)f);
        fwrite("        pop     de\n",0x13,1,(FILE *)f);
        fwrite("        ld      e, d\n",0x15,1,(FILE *)f);
        fwrite("        ld      h, a\n",0x15,1,(FILE *)f);
        fwrite("        call    ___mul_8_\n",0x1a,1,(FILE *)f);
        __ptr = "        ld      a, l\n";
        break;
      case 0x2b:
        fwrite("; addition \n",0xc,1,(FILE *)f);
        fwrite("        pop     de\n",0x13,1,(FILE *)f);
        __ptr = "        add     a, d\n";
        break;
      case 0x2d:
        fwrite("; substraction \n",0x10,1,(FILE *)f);
        fwrite("        ld      d, a\n",0x15,1,(FILE *)f);
        fwrite("        pop     af\n",0x13,1,(FILE *)f);
        __ptr = "        sub     a, d\n";
        break;
      case 0x2f:
        fwrite("; division \n",0xc,1,(FILE *)f);
        fwrite("        pop     de\n",0x13,1,(FILE *)f);
        fwrite("        ld      e, a\n",0x15,1,(FILE *)f);
        fwrite("        call    ___div_u8_\n",0x1b,1,(FILE *)f);
        __ptr = "        ld      a, d\n";
      }
      __size = 0x15;
      goto LAB_00104229;
    }
    if (nVar1 == ASSIGN) {
      gen_assign(node);
      return;
    }
    if ((nVar1 != UNOP) || (gen_expr(*node->children), node->id != 0x8c)) {
switchD_00103fd4_caseD_26:
      return;
    }
    fwrite("; negative (8 bits)\n",0x14,1,(FILE *)f);
    fwrite("        cpl\n",0xc,1,(FILE *)f);
    __ptr = "        inc     a\n";
  }
  __size = 0x12;
LAB_00104229:
  fwrite(__ptr,__size,1,(FILE *)f);
  return;
}

Assistant:

void gen_expr(_node_t* node)
{
    if (node->id == IDENTIFIER)
    {
        TODO("check existing ");
        fprintf(f, "        ld      bc, %s\n", node->identifier);
        fprintf(f, "        ld      a, [bc]\n"); /* 8-bits only */
    }
    else if (node->id == CONSTANT)
    {
        fprintf(f, "; load constant\n");
        if (!node->num_value)
            fprintf(f, "        xor     a\n");
        else
            fprintf(f, "        ld      a, $%02X\n", node->num_value);
    }
    else if (node->type == UNOP)
    {
        gen_expr(node->children[0]);

        switch(node->id)
        {
        case POSITIVE:
            break;

        case NEGATIVE:
            fprintf(f, "; negative (8 bits)\n");
            fprintf(f, "        cpl\n");
            fprintf(f, "        inc     a\n");
            break;
        }
    }
    else if (node->type == BINOP)
    {
        gen_expr(node->children[LEFTOP]);
        fprintf(f, "        push    af\n");
        gen_expr(node->children[RIGHTOP]);
        switch(node->id)
        {

        case '+':
            fprintf(f, "; addition \n");
            fprintf(f, "        pop     de\n");
            fprintf(f, "        add     a, d\n");
            break;

        case '-':
            fprintf(f, "; substraction \n");
            fprintf(f, "        ld      d, a\n");
            fprintf(f, "        pop     af\n");
            fprintf(f, "        sub     a, d\n");
            break;

        case '*':
            fprintf(f, "; multiplication \n");
            fprintf(f, "        pop     de\n");
            fprintf(f, "        ld      e, d\n");
            fprintf(f, "        ld      h, a\n");
            fprintf(f, "        call    ___mul_8_\n");
            fprintf(f, "        ld      a, l\n");
            break;

        case '/':
            fprintf(f, "; division \n");
            fprintf(f, "        pop     de\n");
            fprintf(f, "        ld      e, a\n");
            fprintf(f, "        call    ___div_u8_\n");
            fprintf(f, "        ld      a, d\n");
            break;

        case '%':
            fprintf(f, "; modulo \n");
            fprintf(f, "        pop     de\n");
            fprintf(f, "        ld      e, a\n");
            fprintf(f, "        call    ___div_u8_\n");
            break;
        }
    }
    else if (node->type == ASSIGN)
    {
        gen_assign(node);
    }
}